

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O3

bool __thiscall
duckdb::ConjunctionAndFilter::Equals(ConjunctionAndFilter *this,TableFilter *other_p)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  ConjunctionAndFilter *pCVar5;
  const_reference pvVar6;
  pointer pTVar7;
  type pTVar8;
  size_type __n;
  int iVar4;
  
  if ((this->super_ConjunctionFilter).super_TableFilter.filter_type != other_p->filter_type) {
    return false;
  }
  pCVar5 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(other_p);
  puVar1 = (pCVar5->super_ConjunctionFilter).child_filters.
           super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pCVar5->super_ConjunctionFilter).child_filters.
           super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)puVar2 - (long)puVar1 ==
      (long)(this->super_ConjunctionFilter).child_filters.
            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_ConjunctionFilter).child_filters.
            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    if (puVar2 == puVar1) {
      cVar3 = '\x01';
    }
    else {
      __n = 0;
      do {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](&(this->super_ConjunctionFilter).child_filters,__n);
        pTVar7 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->(pvVar6);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](&(pCVar5->super_ConjunctionFilter).child_filters,__n);
        pTVar8 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(pvVar6);
        iVar4 = (*pTVar7->_vptr_TableFilter[5])(pTVar7,pTVar8);
        cVar3 = (char)iVar4;
        if (cVar3 == '\0') {
          return false;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(pCVar5->super_ConjunctionFilter).child_filters.
                                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pCVar5->super_ConjunctionFilter).child_filters.
                                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

virtual bool Equals(const TableFilter &other) const {
		return filter_type == other.filter_type;
	}